

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outchars.c
# Opt level: O0

void apply_override(curses_drawing_info *di,curses_symdef *ovr,wchar_t olen,nh_bool cust)

{
  nh_bool nVar1;
  nh_bool nVar2;
  nh_bool nVar3;
  nh_bool nVar4;
  nh_bool nVar5;
  nh_bool nVar6;
  nh_bool nVar7;
  nh_bool nVar8;
  nh_bool nVar9;
  nh_bool nVar10;
  nh_bool nVar11;
  nh_bool nVar12;
  nh_bool nVar13;
  wchar_t local_24;
  nh_bool ok;
  wchar_t i;
  nh_bool cust_local;
  wchar_t olen_local;
  curses_symdef *ovr_local;
  curses_drawing_info *di_local;
  
  for (local_24 = L'\0'; local_24 < olen; local_24 = local_24 + L'\x01') {
    nVar1 = apply_override_list(di->bgelements,di->num_bgelements,ovr + local_24,cust);
    nVar2 = apply_override_list(di->traps,di->num_traps,ovr + local_24,cust);
    nVar3 = apply_override_list(di->objects,di->num_objects,ovr + local_24,cust);
    nVar4 = apply_override_list(di->monsters,di->num_monsters,ovr + local_24,cust);
    nVar5 = apply_override_list(di->warnings,di->num_warnings,ovr + local_24,cust);
    nVar6 = apply_override_list(di->invis,L'\x01',ovr + local_24,cust);
    nVar7 = apply_override_list(di->effects,di->num_effects,ovr + local_24,cust);
    nVar8 = apply_override_list(di->expltypes,di->num_expltypes,ovr + local_24,cust);
    nVar9 = apply_override_list(di->explsyms,L'\t',ovr + local_24,cust);
    nVar10 = apply_override_list(di->zaptypes,di->num_zaptypes,ovr + local_24,cust);
    nVar11 = apply_override_list(di->zapsyms,L'\x04',ovr + local_24,cust);
    nVar12 = apply_override_list(di->breathsyms,L'\x04',ovr + local_24,cust);
    nVar13 = apply_override_list(di->swallowsyms,L'\b',ovr + local_24,cust);
    if ((((((((((((nVar1 == '\0' && nVar2 == '\0') && nVar3 == '\0') && nVar4 == '\0') &&
               nVar5 == '\0') && nVar6 == '\0') && nVar7 == '\0') && nVar8 == '\0') && nVar9 == '\0'
           ) && nVar10 == '\0') && nVar11 == '\0') && nVar12 == '\0') && nVar13 == '\0') {
      fprintf(_stdout,"sym override %s could not be applied\n",ovr[local_24].symname);
    }
  }
  return;
}

Assistant:

static void apply_override(struct curses_drawing_info *di,
			   const struct curses_symdef *ovr, int olen, nh_bool cust)
{
    int i;
    nh_bool ok;
    
    for (i = 0; i < olen; i++) {
	ok = FALSE;
	/* the override will effect exactly one of the symbol lists */
	ok |= apply_override_list(di->bgelements, di->num_bgelements, &ovr[i], cust);
	ok |= apply_override_list(di->traps, di->num_traps, &ovr[i], cust);
	ok |= apply_override_list(di->objects, di->num_objects, &ovr[i], cust);
	ok |= apply_override_list(di->monsters, di->num_monsters, &ovr[i], cust);
	ok |= apply_override_list(di->warnings, di->num_warnings, &ovr[i], cust);
	ok |= apply_override_list(di->invis, 1, &ovr[i], cust);
	ok |= apply_override_list(di->effects, di->num_effects, &ovr[i], cust);
	ok |= apply_override_list(di->expltypes, di->num_expltypes, &ovr[i], cust);
	ok |= apply_override_list(di->explsyms, NUMEXPCHARS, &ovr[i], cust);
	ok |= apply_override_list(di->zaptypes, di->num_zaptypes, &ovr[i], cust);
	ok |= apply_override_list(di->zapsyms, NUMZAPCHARS, &ovr[i], cust);
	ok |= apply_override_list(di->breathsyms, NUMBREATHCHARS, &ovr[i], cust);
	ok |= apply_override_list(di->swallowsyms, NUMSWALLOWCHARS, &ovr[i], cust);
	
	if (!ok)
	    fprintf(stdout, "sym override %s could not be applied\n", ovr[i].symname);
    }
}